

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::~Parser(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  BackgroundParser *this_00;
  undefined4 *puVar3;
  JobProcessor *this_01;
  BackgroundJobProcessor *pBVar4;
  bool result;
  BackgroundJobProcessor *processor;
  BackgroundParser *bgp;
  Parser *this_local;
  
  ReleaseTemporaryGuestArena(this);
  if ((this->m_hasParallelJob & 1U) != 0) {
    this_00 = Js::ScriptContext::GetBackgroundParser(this->m_scriptContext);
    if (this_00 == (BackgroundParser *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x8a,"(bgp)","bgp");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_01 = JsUtil::JobManager::Processor((JobManager *)this_00);
    bVar2 = JsUtil::JobProcessor::ProcessesInBackground(this_01);
    if (bVar2) {
      pBVar4 = (BackgroundJobProcessor *)JsUtil::JobManager::Processor((JobManager *)this_00);
      bVar2 = JsUtil::BackgroundJobProcessor::IterateBackgroundThreads<Parser::~Parser()::__0>
                        (pBVar4);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x93,"(result)","result");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
  }
  Scanner<UTF8EncodingPolicyBase<false>_>::~Scanner(&this->m_scan);
  SList<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>::~SList
            (&this->m_registeredRegexPatterns);
  Memory::AutoRecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::~AutoRecyclerRootPtr
            (&this->m_tempGuestArena);
  Memory::ArenaAllocator::~ArenaAllocator(&this->m_nodeAllocator);
  return;
}

Assistant:

Parser::~Parser(void)
{
    this->ReleaseTemporaryGuestArena();

#if ENABLE_BACKGROUND_PARSING
    if (this->m_hasParallelJob)
    {
        // Let the background threads know that they can decommit their arena pages.
        BackgroundParser *bgp = m_scriptContext->GetBackgroundParser();
        Assert(bgp);
        if (bgp->Processor()->ProcessesInBackground())
        {
            JsUtil::BackgroundJobProcessor *processor = static_cast<JsUtil::BackgroundJobProcessor*>(bgp->Processor());

            bool result = processor->IterateBackgroundThreads([&](JsUtil::ParallelThreadData *threadData)->bool {
                threadData->canDecommit = true;
                return false;
            });
            Assert(result);
        }
    }
#endif
}